

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

void DoSectorDamage(AActor *actor,sector_t *sec,int amount,FName *type,PClassActor *protectClass,
                   int flags)

{
  int damage;
  sector_t *psVar1;
  bool bVar2;
  uint uVar3;
  AInventory *pAVar4;
  double checkz;
  TAngle<double> local_48;
  FName local_3c;
  TFlags<ActorFlag,_unsigned_int> local_38;
  uint local_34;
  PClassActor *pPStack_30;
  int flags_local;
  PClassActor *protectClass_local;
  FName *type_local;
  sector_t *psStack_18;
  int amount_local;
  sector_t *sec_local;
  AActor *actor_local;
  
  local_34 = flags;
  pPStack_30 = protectClass;
  protectClass_local = (PClassActor *)type;
  type_local._4_4_ = amount;
  psStack_18 = sec;
  sec_local = (sector_t *)actor;
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_38,
             (int)actor +
             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
  uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_38);
  psVar1 = sec_local;
  if (((uVar3 != 0) && (((local_34 & 2) != 0 || (sec_local[1].planes[0].xform.xScale != 0.0)))) &&
     (((local_34 & 1) != 0 || (sec_local[1].planes[0].xform.xScale == 0.0)))) {
    if ((local_34 & 4) == 0) {
      checkz = secplane_t::ZatPoint(&psStack_18->floorplane,(AActor *)sec_local);
      bVar2 = AActor::isAtZ((AActor *)psVar1,checkz);
      if ((!bVar2) && (*(int *)&sec_local[1].floorplane.normal.Y == 0)) {
        return;
      }
    }
    if ((pPStack_30 == (PClassActor *)0x0) ||
       (pAVar4 = AActor::FindInventory((AActor *)sec_local,pPStack_30,(local_34 & 8) != 0),
       pAVar4 == (AInventory *)0x0)) {
      psVar1 = sec_local;
      damage = type_local._4_4_;
      FName::FName(&local_3c,type);
      TAngle<double>::TAngle(&local_48,0.0);
      P_DamageMobj((AActor *)psVar1,(AActor *)0x0,(AActor *)0x0,damage,&local_3c,0,&local_48);
    }
  }
  return;
}

Assistant:

static void DoSectorDamage(AActor *actor, sector_t *sec, int amount, FName type, PClassActor *protectClass, int flags)
{
	if (!(actor->flags & MF_SHOOTABLE))
		return;

	if (!(flags & DAMAGE_NONPLAYERS) && actor->player == NULL)
		return;

	if (!(flags & DAMAGE_PLAYERS) && actor->player != NULL)
		return;

	if (!(flags & DAMAGE_IN_AIR) && !actor->isAtZ(sec->floorplane.ZatPoint(actor)) && !actor->waterlevel)
		return;

	if (protectClass != NULL)
	{
		if (actor->FindInventory(protectClass, !!(flags & DAMAGE_SUBCLASSES_PROTECT)))
			return;
	}

	P_DamageMobj (actor, NULL, NULL, amount, type);
}